

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

void rpn_NEG(Expression *expr,Expression *src)

{
  bool bVar1;
  uint8_t *puVar2;
  Expression *src_local;
  Expression *expr_local;
  
  memcpy(expr,src,0x30);
  expr->isSymbol = false;
  bVar1 = rpn_isKnown(expr);
  if (bVar1) {
    expr->val = -expr->val;
  }
  else {
    expr->rpnPatchSize = expr->rpnPatchSize + 1;
    puVar2 = reserveSpace(expr,1);
    *puVar2 = '\x05';
  }
  return;
}

Assistant:

void rpn_NEG(struct Expression *expr, const struct Expression *src)
{
	*expr = *src;
	expr->isSymbol = false;

	if (rpn_isKnown(expr)) {
		expr->val = -(uint32_t)expr->val;
	} else {
		expr->rpnPatchSize++;
		*reserveSpace(expr, 1) = RPN_NEG;
	}
}